

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O2

void embree::os_free(void *ptr,size_t bytes,bool hugepages)

{
  int iVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  
  if (bytes != 0) {
    lVar4 = bytes + 0x1000;
    uVar3 = 0xfffffffffffff000;
    if (hugepages) {
      uVar3 = 0xffffffffffe00000;
      lVar4 = bytes + 0x200000;
    }
    iVar1 = munmap(ptr,lVar4 - 1U & uVar3);
    if (iVar1 == -1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::streambuf::xsgetn;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

void os_free(void* ptr, size_t bytes, bool hugepages) 
  {
    if (bytes == 0)
      return;

    /* for hugepages we need to also align the size */
    const size_t pageSize = hugepages ? PAGE_SIZE_2M : PAGE_SIZE_4K;
    bytes = (bytes+pageSize-1) & ~(pageSize-1);
    if (munmap(ptr,bytes) == -1)
      throw std::bad_alloc();
  }